

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O3

void Kit_TruthPrintProfile_int(uint *pTruth,int nVars)

{
  ulong uVar1;
  ulong uVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *pBytesInit;
  uint *pOut;
  uint *pOut_00;
  uint *pOut_01;
  uint *pOut_02;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  int Unique1 [20];
  int Mints1 [20];
  int Mints0 [20];
  int Mints [20];
  int Common2 [20] [20];
  int Unique2 [20] [20];
  int Total2 [20] [20];
  uint *local_14e8;
  uint *local_14e0;
  uint auStack_1438 [20];
  int local_13e8 [20];
  int local_1398 [20];
  uint local_1348 [20];
  int local_12f8 [400];
  int local_cb8 [400];
  int local_678 [402];
  
  uVar2 = (ulong)(uint)nVars;
  uVar11 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar11 = 1;
  }
  pBytesInit = (int *)malloc((long)(int)(uVar11 * 4) << 2);
  sVar14 = (long)(int)uVar11 << 2;
  local_14e0 = (uint *)malloc(sVar14);
  local_14e8 = (uint *)malloc(sVar14);
  pOut = (uint *)malloc(sVar14);
  pOut_00 = (uint *)malloc(sVar14);
  pOut_01 = (uint *)malloc(sVar14);
  pOut_02 = (uint *)malloc(sVar14);
  if (0x14 < nVars) {
    __assert_fail("nVars <= 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x803,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
  }
  if (nVars < 6) {
    __assert_fail("nVars >= 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x804,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
  }
  iVar4 = Kit_TruthCountMinterms(pTruth,nVars,(int *)local_1348,pBytesInit);
  uVar23 = 0;
  do {
    uVar5 = Kit_TruthBooleanDiffCount(pTruth,nVars,(int)uVar23);
    auStack_1438[uVar23] = uVar5;
    uVar23 = uVar23 + 1;
  } while (uVar2 != uVar23);
  sVar14 = uVar2 * 4;
  lVar22 = 0;
  do {
    memset((void *)((long)local_12f8 + lVar22),0xff,sVar14);
    memset((void *)((long)local_cb8 + lVar22),0xff,sVar14);
    memset((void *)((long)local_678 + lVar22),0xff,sVar14);
    lVar22 = lVar22 + 0x50;
  } while (uVar2 * 0x50 != lVar22);
  iVar12 = 1 << ((char)nVars - 2U & 0x1f);
  uVar5 = nVars - 1;
  uVar23 = 0;
  do {
    uVar9 = (ulong)uVar11 + 1;
    if (0 < (int)uVar11) {
      do {
        local_14e0[uVar9 - 2] = pTruth[uVar9 - 2];
        uVar9 = uVar9 - 1;
      } while (1 < uVar9);
    }
    puVar3 = local_14e0;
    uVar9 = uVar23;
    if ((long)uVar23 < (long)(int)uVar5) {
      do {
        local_14e0 = local_14e8;
        local_14e8 = puVar3;
        Kit_TruthSwapAdjacentVars(local_14e0,local_14e8,nVars,(int)uVar9);
        uVar24 = (int)uVar9 + 1;
        puVar3 = local_14e0;
        uVar9 = (ulong)uVar24;
      } while (uVar5 != uVar24);
    }
    iVar6 = Kit_TruthCountMinterms(local_14e0,uVar5,local_1398,pBytesInit);
    puVar3 = local_14e0 + (int)uVar11 / 2;
    iVar7 = Kit_TruthCountMinterms(puVar3,uVar5,local_13e8,pBytesInit);
    if (iVar4 != iVar7 + iVar6) {
      __assert_fail("nTotalMints == nTotalMints0 + nTotalMints1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                    ,0x820,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
    }
    uVar9 = 0;
    do {
      uVar1 = uVar9 + 1;
      uVar10 = uVar1;
      if (uVar9 < uVar23) {
        uVar10 = uVar9;
      }
      uVar10 = uVar10 & 0xffffffff;
      if (uVar23 == uVar10) {
        __assert_fail("v != iVar",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x830,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      uVar24 = local_1348[uVar9 - 0x14];
      if (((int)uVar24 < 0) || (iVar12 < (int)uVar24)) {
        __assert_fail("Cof00 >= 0 && Cof00 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x837,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar13 = iVar6 - uVar24;
      if ((iVar13 < 0) || (iVar12 < iVar13)) {
        __assert_fail("Cof01 >= 0 && Cof01 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x838,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar8 = local_13e8[uVar9];
      if ((iVar8 < 0) || (iVar12 < iVar8)) {
        __assert_fail("Cof10 >= 0 && Cof10 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x839,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar16 = iVar7 - iVar8;
      if ((iVar16 < 0) || (iVar12 < iVar16)) {
        __assert_fail("Cof11 >= 0 && Cof11 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83a,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar17 = iVar12 - uVar24;
      if (iVar17 < 0) {
        __assert_fail("Coz00 >= 0 && Coz00 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83c,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar19 = iVar12 - iVar13;
      if (iVar19 < 0) {
        __assert_fail("Coz01 >= 0 && Coz01 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83d,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar18 = iVar12 - iVar8;
      if (iVar18 < 0) {
        __assert_fail("Coz10 >= 0 && Coz10 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83e,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar20 = iVar12 - iVar16;
      if (iVar20 < 0) {
        __assert_fail("Coz11 >= 0 && Coz11 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83f,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar21 = iVar19 * iVar8 + iVar18 * iVar13 + iVar16 * iVar17 + iVar20 * uVar24;
      local_12f8[uVar10 * 0x14 + uVar23] = iVar21;
      local_12f8[uVar23 * 0x14 + uVar10] = iVar21;
      iVar13 = (iVar8 + iVar13) * iVar17 + iVar20 * (iVar8 + iVar13) + iVar16 * (iVar18 + iVar19) +
               iVar21 + (iVar18 + iVar19) * uVar24;
      local_678[uVar10 * 0x14 + uVar23] = iVar13;
      local_678[uVar23 * 0x14 + uVar10] = iVar13;
      iVar13 = (int)uVar1 + -1;
      Kit_TruthCofactor0New(pOut,local_14e0,uVar5,iVar13);
      Kit_TruthCofactor1New(pOut_00,local_14e0,uVar5,iVar13);
      Kit_TruthCofactor0New(pOut_01,puVar3,uVar5,iVar13);
      Kit_TruthCofactor1New(pOut_02,puVar3,uVar5,iVar13);
      iVar13 = Kit_TruthXorCount(pOut,pOut_00,uVar5);
      iVar8 = Kit_TruthXorCount(pOut,pOut_01,uVar5);
      iVar16 = Kit_TruthXorCount(pOut,pOut_02,uVar5);
      iVar17 = Kit_TruthXorCount(pOut_00,pOut_01,uVar5);
      iVar19 = Kit_TruthXorCount(pOut_00,pOut_02,uVar5);
      iVar18 = Kit_TruthXorCount(pOut_01,pOut_02,uVar5);
      iVar13 = iVar18 + iVar19 + iVar17 + iVar16 + iVar8 + iVar13;
      local_cb8[uVar10 * 0x14 + uVar23] = iVar13;
      local_cb8[uVar23 * 0x14 + uVar10] = iVar13;
      uVar9 = uVar1;
    } while (uVar1 != uVar5);
    uVar23 = uVar23 + 1;
    if (uVar23 == uVar2) {
      putchar(10);
      printf(" V: ");
      uVar11 = 0x61;
      do {
        printf("%8c  ",(ulong)uVar11);
        iVar4 = uVar11 - nVars;
        uVar11 = uVar11 + 1;
      } while (iVar4 != 0x60);
      putchar(10);
      printf(" M: ");
      uVar23 = 0;
      do {
        printf("%8d  ",(ulong)local_1348[uVar23]);
        uVar23 = uVar23 + 1;
      } while (uVar2 != uVar23);
      putchar(10);
      printf(" U: ");
      uVar23 = 0;
      do {
        printf("%8d  ",(ulong)auStack_1438[uVar23]);
        uVar23 = uVar23 + 1;
      } while (uVar2 != uVar23);
      putchar(10);
      putchar(10);
      puts("Unique:");
      piVar15 = local_cb8;
      uVar23 = 0;
      do {
        printf(" %2d ",uVar23 & 0xffffffff);
        uVar9 = 0;
        do {
          printf("%8d  ",(ulong)(uint)piVar15[uVar9]);
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
        putchar(10);
        uVar23 = uVar23 + 1;
        piVar15 = piVar15 + 0x14;
      } while (uVar23 != uVar2);
      puts("Common:");
      piVar15 = local_12f8;
      uVar23 = 0;
      do {
        printf(" %2d ",uVar23 & 0xffffffff);
        uVar9 = 0;
        do {
          printf("%8d  ",(ulong)(uint)piVar15[uVar9]);
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
        putchar(10);
        uVar23 = uVar23 + 1;
        piVar15 = piVar15 + 0x14;
      } while (uVar23 != uVar2);
      puts("Total:");
      piVar15 = local_678;
      uVar23 = 0;
      do {
        printf(" %2d ",uVar23 & 0xffffffff);
        uVar9 = 0;
        do {
          printf("%8d  ",(ulong)(uint)piVar15[uVar9]);
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
        putchar(10);
        uVar23 = uVar23 + 1;
        piVar15 = piVar15 + 0x14;
      } while (uVar23 != uVar2);
      if (local_14e0 != (uint *)0x0) {
        free(local_14e0);
      }
      if (local_14e8 != (uint *)0x0) {
        free(local_14e8);
      }
      if (pOut != (uint *)0x0) {
        free(pOut);
      }
      if (pOut_00 != (uint *)0x0) {
        free(pOut_00);
      }
      if (pOut_01 != (uint *)0x0) {
        free(pOut_01);
      }
      if (pOut_02 != (uint *)0x0) {
        free(pOut_02);
      }
      if (pBytesInit == (int *)0x0) {
        return;
      }
      free(pBytesInit);
      return;
    }
  } while( true );
}

Assistant:

void Kit_TruthPrintProfile_int( unsigned * pTruth, int nVars )
{
    int Mints[20];
    int Mints0[20];
    int Mints1[20];
    int Unique1[20];
    int Total2[20][20];
    int Unique2[20][20];
    int Common2[20][20];
    int nWords = Kit_TruthWordNum( nVars );
    int * pBytes    = ABC_ALLOC( int, nWords * 4 );
    unsigned * pIn  = ABC_ALLOC( unsigned, nWords );
    unsigned * pOut = ABC_ALLOC( unsigned, nWords );
    unsigned * pCof00 = ABC_ALLOC( unsigned, nWords );
    unsigned * pCof01 = ABC_ALLOC( unsigned, nWords );
    unsigned * pCof10 = ABC_ALLOC( unsigned, nWords );
    unsigned * pCof11 = ABC_ALLOC( unsigned, nWords );
    unsigned * pTemp;
    int nTotalMints, nTotalMints0, nTotalMints1;
    int v, u, i, iVar, nMints1;
    int Cof00, Cof01, Cof10, Cof11;
    int Coz00, Coz01, Coz10, Coz11;
    assert( nVars <= 20 );
    assert( nVars >=  6 );

    nTotalMints = Kit_TruthCountMinterms( pTruth, nVars, Mints, pBytes );
    for ( v = 0; v < nVars; v++ )
        Unique1[v] = Kit_TruthBooleanDiffCount( pTruth, nVars, v );

    for ( v = 0; v < nVars; v++ )
    for ( u = 0; u < nVars; u++ )
        Total2[v][u] = Unique2[v][u] = Common2[v][u] = -1;

    nMints1 = (1<<(nVars-2));
    for ( v = 0; v < nVars; v++ )
    {
        // move this var to be the first
        Kit_TruthCopy( pIn, pTruth, nVars );
//        Extra_PrintBinary( stdout, pIn, (1<<nVars) ); printf( "\n" );
        for ( i = v; i < nVars - 1; i++ )
        {
            Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
//        Extra_PrintBinary( stdout, pIn, (1<<nVars) ); printf( "\n" );
//        printf( "\n" );


        // count minterms in both cofactor
        nTotalMints0 = Kit_TruthCountMinterms( pIn,          nVars-1, Mints0, pBytes );
        nTotalMints1 = Kit_TruthCountMinterms( pIn+nWords/2, nVars-1, Mints1, pBytes );
        assert( nTotalMints == nTotalMints0 + nTotalMints1 );
/*
        for ( u = 0; u < nVars-1; u++ )
            printf( "%2d ", Mints0[u] );
        printf( "\n" );

        for ( u = 0; u < nVars-1; u++ )
            printf( "%2d ", Mints1[u] );
        printf( "\n" );
*/
        for ( u = 0; u < nVars-1; u++ )
        {
            if ( u < v )
                iVar = u;
            else 
                iVar = u + 1;
            assert( v != iVar );
            // get minter counts in the cofactors
            Cof00 =              Mints0[u]; Coz00 = nMints1 - Cof00;              
            Cof01 = nTotalMints0-Mints0[u]; Coz01 = nMints1 - Cof01;
            Cof10 =              Mints1[u]; Coz10 = nMints1 - Cof10;
            Cof11 = nTotalMints1-Mints1[u]; Coz11 = nMints1 - Cof11;

            assert( Cof00 >= 0 && Cof00 <= nMints1 );
            assert( Cof01 >= 0 && Cof01 <= nMints1 );
            assert( Cof10 >= 0 && Cof10 <= nMints1 );
            assert( Cof11 >= 0 && Cof11 <= nMints1 );

            assert( Coz00 >= 0 && Coz00 <= nMints1 );
            assert( Coz01 >= 0 && Coz01 <= nMints1 );
            assert( Coz10 >= 0 && Coz10 <= nMints1 );
            assert( Coz11 >= 0 && Coz11 <= nMints1 );

            Common2[v][iVar] = Common2[iVar][v] = Cof00 * Coz11 + Coz00 * Cof11 + Cof01 * Coz10 + Coz01 * Cof10;

            Total2[v][iVar] = Total2[iVar][v] = 
                Cof00 * Coz01 + Coz00 * Cof01 + 
                Cof00 * Coz10 + Coz00 * Cof10 + 
                Cof00 * Coz11 + Coz00 * Cof11 + 
                Cof01 * Coz10 + Coz01 * Cof10 + 
                Cof01 * Coz11 + Coz01 * Cof11 + 
                Cof10 * Coz11 + Coz10 * Cof11 ;

            
            Kit_TruthCofactor0New( pCof00, pIn,          nVars-1, u );
            Kit_TruthCofactor1New( pCof01, pIn,          nVars-1, u );
            Kit_TruthCofactor0New( pCof10, pIn+nWords/2, nVars-1, u );
            Kit_TruthCofactor1New( pCof11, pIn+nWords/2, nVars-1, u );

            Unique2[v][iVar] = Unique2[iVar][v] = 
                Kit_TruthXorCount( pCof00, pCof01, nVars-1 ) +
                Kit_TruthXorCount( pCof00, pCof10, nVars-1 ) +
                Kit_TruthXorCount( pCof00, pCof11, nVars-1 ) +
                Kit_TruthXorCount( pCof01, pCof10, nVars-1 ) +
                Kit_TruthXorCount( pCof01, pCof11, nVars-1 ) +
                Kit_TruthXorCount( pCof10, pCof11, nVars-1 );
        }
    }

    printf( "\n" );
    printf( " V: " );
    for ( v = 0; v < nVars; v++ )
        printf( "%8c  ", v+'a' );
    printf( "\n" );

    printf( " M: " );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Mints[v] );
    printf( "\n" );

    printf( " U: " );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Unique1[v] );
    printf( "\n" );
    printf( "\n" );

    printf( "Unique:\n" );
    for ( i = 0; i < nVars; i++ )
    {
    printf( " %2d ", i );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Unique2[i][v] );
    printf( "\n" );
    }

    printf( "Common:\n" );
    for ( i = 0; i < nVars; i++ )
    {
    printf( " %2d ", i );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Common2[i][v] );
    printf( "\n" );
    }

    printf( "Total:\n" );
    for ( i = 0; i < nVars; i++ )
    {
    printf( " %2d ", i );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Total2[i][v] );
    printf( "\n" );
    }

    ABC_FREE( pIn );
    ABC_FREE( pOut );
    ABC_FREE( pCof00 );
    ABC_FREE( pCof01 );
    ABC_FREE( pCof10 );
    ABC_FREE( pCof11 );
    ABC_FREE( pBytes );
}